

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void google::protobuf::internal::MapMergeFrom<unsigned_int,proto2_unittest::TestIntIntMap>
               (Map<unsigned_int,_proto2_unittest::TestIntIntMap> *dest,
               Map<unsigned_int,_proto2_unittest::TestIntIntMap> *src)

{
  Map<unsigned_int,_proto2_unittest::TestIntIntMap> *__range3;
  uint uVar1;
  ulong uVar2;
  TestIntIntMap *this;
  NodeBase *pNVar3;
  pair<google::protobuf::Map<unsigned_int,_proto2_unittest::TestIntIntMap>::iterator,_bool> local_50
  ;
  
  uVar1 = (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.index_of_first_non_null_;
  uVar2 = (ulong)uVar1;
  if (uVar1 == (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_) {
    uVar2 = 0;
    pNVar3 = (NodeBase *)0x0;
  }
  else {
    pNVar3 = (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar2];
    if (pNVar3 == (NodeBase *)0x0) {
      protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  do {
    do {
      if (pNVar3 == (NodeBase *)0x0) {
        return;
      }
      Map<unsigned_int,proto2_unittest::TestIntIntMap>::TryEmplaceInternal<unsigned_int_const&>
                (&local_50,dest,(uint *)(pNVar3 + 1));
      if (pNVar3 != local_50.first.super_UntypedMapIterator.node_) {
        this = (TestIntIntMap *)(local_50.first.super_UntypedMapIterator.node_ + 2);
        proto2_unittest::TestIntIntMap::Clear(this);
        proto2_unittest::TestIntIntMap::MergeImpl((MessageLite *)this,(MessageLite *)(pNVar3 + 2));
      }
      pNVar3 = pNVar3->next;
    } while (pNVar3 != (NodeBase *)0x0);
    do {
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
      if ((src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_ <= uVar1) {
        pNVar3 = (NodeBase *)0x0;
        uVar2 = 0;
        break;
      }
      pNVar3 = (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar1];
    } while (pNVar3 == (NodeBase *)0x0);
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}